

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::
_preBegin__alpha____gles_texcombiner_commandAlpha_type
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *buffer;
  ulong in_RAX;
  byte *pbVar1;
  StringHash SVar2;
  undefined4 uVar3;
  uint *puVar4;
  ulong uVar5;
  xmlChar **ppxVar6;
  bool bVar7;
  float fVar8;
  bool failed;
  bool failed_1;
  undefined8 uStack_38;
  
  pbVar1 = (byte *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                               ).super_ParserTemplateBase.mStackMemoryManager,0xc);
  pbVar1[0] = 0;
  pbVar1[1] = 0;
  pbVar1[2] = 0;
  pbVar1[3] = 0;
  pbVar1[4] = 7;
  pbVar1[5] = 0;
  pbVar1[6] = 0;
  pbVar1[7] = 0;
  pbVar1[8] = 0;
  pbVar1[9] = 0;
  pbVar1[10] = 0;
  pbVar1[0xb] = 0;
  *attributeDataPtr = pbVar1;
  ppxVar6 = attributes->attributes;
  bVar7 = true;
  if (ppxVar6 != (xmlChar **)0x0) {
    uStack_38 = in_RAX;
    do {
      text = *ppxVar6;
      if (text == (ParserChar *)0x0) {
        validationDataPtr = (void **)0x3;
      }
      else {
        SVar2 = GeneratedSaxParser::Utils::calculateStringHash(text);
        buffer = ppxVar6[1];
        ppxVar6 = ppxVar6 + 2;
        if (SVar2 == 0x799825) {
          fVar8 = GeneratedSaxParser::Utils::toFloat(buffer,(bool *)((long)&uStack_38 + 7));
          *(float *)(pbVar1 + 8) = fVar8;
          if ((uStack_38._7_1_ == '\x01') &&
             (bVar7 = GeneratedSaxParser::ParserTemplateBase::handleError
                                ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                 ERROR_ATTRIBUTE_PARSING_FAILED,0x6836e1,0x799825,buffer), bVar7)) {
LAB_006b3912:
            bVar7 = false;
            validationDataPtr = (void **)0x1;
          }
          else {
            validationDataPtr = (void **)0x4;
            bVar7 = true;
            if (uStack_38._7_1_ == '\0') {
              *pbVar1 = *pbVar1 | 1;
            }
          }
LAB_006b3951:
          if (!bVar7) goto LAB_006b3958;
        }
        else {
          if (SVar2 == 0x6c88e02) {
            SVar2 = GeneratedSaxParser::Utils::calculateStringHash
                              (buffer,(bool *)((long)&uStack_38 + 6));
            bVar7 = false;
            uVar5 = 0;
            puVar4 = &DAT_0085e648;
            do {
              if (*(StringHash *)(puVar4 + -2) == SVar2) {
                uStack_38 = uStack_38 & 0xff00000000000000;
                validationDataPtr = (void **)(ulong)*puVar4;
              }
              uVar3 = SUB84(validationDataPtr,0);
              if (*(StringHash *)(puVar4 + -2) == SVar2) break;
              bVar7 = 4 < uVar5;
              uVar5 = uVar5 + 1;
              puVar4 = puVar4 + 4;
            } while (uVar5 != 6);
            if (bVar7) {
              uStack_38 = CONCAT17(uStack_38._7_1_,0x1000000000000);
              uVar3 = 6;
            }
            *(undefined4 *)(pbVar1 + 4) = uVar3;
            if ((uStack_38._6_1_ == '\x01') &&
               (bVar7 = GeneratedSaxParser::ParserTemplateBase::handleError
                                  ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                                   ERROR_ATTRIBUTE_PARSING_FAILED,0x6836e1,0x6c88e02,buffer), bVar7)
               ) goto LAB_006b3912;
            validationDataPtr = (void **)0x4;
            bVar7 = true;
            goto LAB_006b3951;
          }
          bVar7 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_UNKNOWN_ATTRIBUTE,0x6836e1,text,buffer);
          validationDataPtr = (void **)0x1;
          if (bVar7) goto LAB_006b3958;
        }
        validationDataPtr = (void **)0x0;
      }
LAB_006b3958:
    } while ((int)validationDataPtr == 0);
    if ((int)validationDataPtr == 3) {
      bVar7 = true;
    }
    else {
      bVar7 = false;
    }
  }
  return bVar7;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__alpha____gles_texcombiner_commandAlpha_type( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__alpha____gles_texcombiner_commandAlpha_type( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

alpha____gles_texcombiner_commandAlpha_type__AttributeData* attributeData = newData<alpha____gles_texcombiner_commandAlpha_type__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_operator:
    {
bool failed;
attributeData->_operator = Utils::toEnum<ENUM__gles_texcombiner_operatorAlpha_enums, StringHash, ENUM__gles_texcombiner_operatorAlpha_enums__COUNT>(attributeValue, failed, ENUM__gles_texcombiner_operatorAlpha_enumsMap, Utils::calculateStringHash);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_ALPHA,
        HASH_ATTRIBUTE_operator,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_scale:
    {
bool failed;
attributeData->scale = GeneratedSaxParser::Utils::toFloat(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_ALPHA,
        HASH_ATTRIBUTE_scale,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= alpha____gles_texcombiner_commandAlpha_type__AttributeData::ATTRIBUTE_SCALE_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_ALPHA, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}